

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O1

void __thiscall NaPNStatistics::action(NaPNStatistics *this)

{
  NaVector *pNVar1;
  NaVector *pNVar2;
  double dVar3;
  double dVar4;
  NaReal NVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  NaVector *pNVar11;
  undefined4 extraout_var;
  NaReal *pNVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  NaPetriNet *pNVar13;
  NaTimer *pNVar14;
  undefined4 extraout_var_06;
  double *pdVar15;
  NaVector *pNVar16;
  undefined4 extraout_var_07;
  NaReal *pNVar17;
  char *pcVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  NaVector *pNVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar28;
  double dVar29;
  
  pNVar11 = NaPetriCnInput::data(&this->signal);
  if (this->nGapWidth - 1 < this->nGapAct) {
    NaVector::init_zero(&this->Mean);
    NaVector::init_zero(&this->RMS);
    NaVector::init_zero(&this->StdDev);
    NaVector::init_zero(&this->Min);
    NaVector::init_zero(&this->Max);
    NaVector::init_zero(&this->Sum);
    NaVector::init_zero(&this->Sum2);
    this->nGapAct = 0;
  }
  this->nGapAct = this->nGapAct + 1;
  iVar8 = (*pNVar11->_vptr_NaVector[6])(pNVar11);
  if (iVar8 != 0) {
    pNVar1 = &this->Min;
    pNVar2 = &this->Mean;
    uVar19 = 0;
    do {
      iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar3 = *(double *)CONCAT44(extraout_var,iVar8);
      pNVar12 = NaVector::operator[](&this->Sum,uVar19);
      *pNVar12 = dVar3 + *pNVar12;
      iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar3 = *(double *)CONCAT44(extraout_var_00,iVar8);
      iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar4 = *(double *)CONCAT44(extraout_var_01,iVar8);
      pNVar12 = NaVector::operator[](&this->Sum2,uVar19);
      *pNVar12 = dVar3 * dVar4 + *pNVar12;
      uVar9 = this->nGapAct;
      iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar3 = *(double *)CONCAT44(extraout_var_02,iVar8);
      if (uVar9 == 1) {
        pNVar12 = NaVector::operator[](pNVar1,uVar19);
        *pNVar12 = dVar3;
LAB_00141315:
        iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
        NVar5 = *(NaReal *)CONCAT44(extraout_var_05,iVar8);
        pNVar12 = NaVector::operator[](&this->Max,uVar19);
        *pNVar12 = NVar5;
      }
      else {
        pNVar12 = NaVector::operator[](pNVar1,uVar19);
        if (dVar3 < *pNVar12) {
          iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
          NVar5 = *(NaReal *)CONCAT44(extraout_var_03,iVar8);
          pNVar12 = NaVector::operator[](pNVar1,uVar19);
          *pNVar12 = NVar5;
        }
        iVar8 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
        dVar3 = *(double *)CONCAT44(extraout_var_04,iVar8);
        pNVar12 = NaVector::operator[](&this->Max,uVar19);
        if (*pNVar12 <= dVar3 && dVar3 != *pNVar12) goto LAB_00141315;
      }
      pNVar12 = NaVector::operator[](&this->Sum,uVar19);
      dVar3 = *pNVar12;
      uVar9 = this->nGapAct;
      pNVar12 = NaVector::operator[](pNVar2,uVar19);
      *pNVar12 = dVar3 / (double)uVar9;
      pNVar12 = NaVector::operator[](&this->Sum2,uVar19);
      dVar3 = *pNVar12;
      uVar9 = this->nGapAct;
      pNVar12 = NaVector::operator[](&this->RMS,uVar19);
      *pNVar12 = dVar3 / (double)uVar9;
      pNVar12 = NaVector::operator[](&this->RMS,uVar19);
      dVar3 = *pNVar12;
      pNVar12 = NaVector::operator[](pNVar2,uVar19);
      dVar4 = *pNVar12;
      pNVar12 = NaVector::operator[](pNVar2,uVar19);
      dVar3 = dVar3 - dVar4 * *pNVar12;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      pNVar12 = NaVector::operator[](&this->StdDev,uVar19);
      *pNVar12 = dVar3;
      uVar19 = uVar19 + 1;
      uVar9 = (*pNVar11->_vptr_NaVector[6])(pNVar11);
    } while (uVar19 < uVar9);
  }
  pNVar1 = &this->Min;
  pNVar12 = NaVector::operator[](pNVar1,0);
  dVar3 = *pNVar12;
  pNVar2 = &this->Max;
  pNVar12 = NaVector::operator[](pNVar2,0);
  pNVar23 = pNVar2;
  if (ABS(*pNVar12) < ABS(dVar3)) {
    pNVar23 = pNVar1;
  }
  pNVar12 = NaVector::operator[](pNVar23,0);
  dVar4 = ABS(*pNVar12);
  pNVar13 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar14 = NaPetriNet::timer(pNVar13);
  (*pNVar14->_vptr_NaTimer[4])(pNVar14);
  dVar3 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pNVar13 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar14 = NaPetriNet::timer(pNVar13);
  iVar8 = (*pNVar14->_vptr_NaTimer[5])(pNVar14);
  pNVar23 = &this->Mean;
  iVar22 = 0;
  do {
    uVar19 = 1 << ((byte)iVar22 & 0x1f) & (uint)(ushort)this->mOutStat;
    if (0x1f < uVar19) {
      if (0x7f < uVar19) {
        dVar7 = dVar3;
        if ((uVar19 == 0x80) || (dVar7 = (double)iVar8, uVar19 == 0x100)) goto LAB_001415e8;
        if (uVar19 != 0x200) goto switchD_00141555_caseD_3;
        iVar10 = (*pNVar11->_vptr_NaVector[8])(pNVar11,0);
        pdVar15 = (double *)CONCAT44(extraout_var_06,iVar10);
        goto LAB_001415e4;
      }
      pNVar16 = pNVar1;
      if (uVar19 == 0x20) goto LAB_001415dd;
      dVar7 = dVar4;
      if (uVar19 != 0x40) goto switchD_00141555_caseD_3;
      goto LAB_001415e8;
    }
    switch(uVar19) {
    case 1:
      pNVar12 = NaVector::operator[](pNVar23,0);
      dVar7 = ABS(*pNVar12);
      goto LAB_001415e8;
    case 2:
      pNVar16 = pNVar23;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_00141555_caseD_3;
    case 4:
      pNVar16 = &this->RMS;
      break;
    case 8:
      pNVar16 = &this->StdDev;
      break;
    default:
      pNVar16 = pNVar2;
      if (uVar19 == 0x10) break;
      goto switchD_00141555_caseD_3;
    }
LAB_001415dd:
    pdVar15 = NaVector::operator[](pNVar16,0);
LAB_001415e4:
    dVar7 = *pdVar15;
LAB_001415e8:
    pNVar16 = NaPetriCnOutput::data(&this->stat);
    iVar10 = (*pNVar16->_vptr_NaVector[8])(pNVar16);
    *(double *)CONCAT44(extraout_var_07,iVar10) = dVar7;
switchD_00141555_caseD_3:
    iVar22 = iVar22 + 1;
  } while (iVar22 != 10);
  if (this->nGapWidth - 1 < this->nGapAct) {
    dVar7 = (double)iVar8;
    pNVar12 = &this->HaltCond[0].value;
    lVar20 = 0;
    uVar19 = 0;
    do {
      uVar21 = 1 << ((byte)lVar20 & 0x1f);
      uVar9 = this->mHalt & uVar21 & 0xffff;
      if (0x1f < uVar9) {
        if (uVar9 < 0x80) {
          pNVar11 = pNVar1;
          if (uVar9 == 0x20) goto LAB_00141736;
          if (uVar9 == 0x40) {
            dVar6 = *pNVar12;
            uVar27 = SUB84(dVar6,0);
            uVar28 = (undefined4)((ulong)dVar6 >> 0x20);
            if (-1 < ((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign) {
              dVar29 = dVar4;
              if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign != 0) goto LAB_00141774;
              bVar26 = dVar6 == dVar4;
              goto LAB_0014177b;
            }
            bVar26 = dVar6 == dVar4;
            bVar25 = dVar6 < dVar4;
            goto LAB_00141778;
          }
          goto switchD_00141692_caseD_3;
        }
        if (uVar9 == 0x80) {
          dVar6 = *pNVar12;
          uVar27 = SUB84(dVar6,0);
          uVar28 = (undefined4)((ulong)dVar6 >> 0x20);
          if (-1 < ((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign) {
            dVar29 = dVar3;
            if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign == 0) {
              bVar26 = dVar6 == dVar3;
              goto LAB_0014177b;
            }
            goto LAB_00141774;
          }
          bVar26 = dVar6 == dVar3;
          bVar25 = dVar6 < dVar3;
          goto LAB_00141778;
        }
        if (uVar9 != 0x100) goto switchD_00141692_caseD_3;
        dVar6 = *pNVar12;
        uVar27 = SUB84(dVar6,0);
        uVar28 = (undefined4)((ulong)dVar6 >> 0x20);
        if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign < 0) {
          bVar26 = dVar6 == dVar7;
          bVar25 = dVar6 < dVar7;
          goto LAB_00141778;
        }
        dVar29 = dVar7;
        if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign != 0) goto LAB_00141774;
        bVar26 = dVar6 == dVar7;
        goto LAB_0014177b;
      }
      switch(uVar9) {
      case 1:
        pNVar17 = NaVector::operator[](pNVar23,0);
        uVar27 = SUB84(ABS(*pNVar17),0);
        uVar28 = (undefined4)((ulong)ABS(*pNVar17) >> 0x20);
        goto LAB_00141741;
      case 2:
        pNVar11 = pNVar23;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        goto switchD_00141692_caseD_3;
      case 4:
        pNVar11 = &this->RMS;
        break;
      case 8:
        pNVar11 = &this->StdDev;
        break;
      default:
        pNVar11 = pNVar2;
        if (uVar9 == 0x10) break;
        goto switchD_00141692_caseD_3;
      }
LAB_00141736:
      pNVar17 = NaVector::operator[](pNVar11,0);
      uVar27 = SUB84(*pNVar17,0);
      uVar28 = (undefined4)((ulong)*pNVar17 >> 0x20);
LAB_00141741:
      dVar29 = *pNVar12;
      if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign < 0) {
LAB_00141774:
        bVar26 = dVar29 == (double)CONCAT44(uVar28,uVar27);
        bVar25 = dVar29 < (double)CONCAT44(uVar28,uVar27);
LAB_00141778:
        bVar26 = !bVar25 && !bVar26;
      }
      else {
        if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign != 0) {
          bVar26 = (double)CONCAT44(uVar28,uVar27) == dVar29;
          bVar25 = (double)CONCAT44(uVar28,uVar27) < dVar29;
          goto LAB_00141778;
        }
        bVar26 = (double)CONCAT44(uVar28,uVar27) == dVar29;
      }
LAB_0014177b:
      if (!bVar26) {
        uVar21 = 0;
      }
      uVar19 = uVar19 | uVar21;
switchD_00141692_caseD_3:
      lVar20 = lVar20 + 1;
      pNVar12 = pNVar12 + 2;
    } while (lVar20 != 10);
    if ((uVar19 & 0x3ff) != 0) {
      pcVar18 = NaPetriNode::name(&this->super_NaPetriNode);
      lVar24 = 0;
      NaPrintLog("Statistics node \'%s\' caused halt due to:\n",pcVar18);
      lVar20 = 0;
      do {
        if ((uVar19 >> ((uint)lVar20 & 0x1f) & 1) != 0) {
          NaPrintLog("  %s[0] %s %g\n",
                     (int)*(undefined8 *)((long)&this->HaltCond[0].value + lVar24 * 2),
                     *(undefined8 *)((long)szId + lVar24),
                     szSign[(long)*(int *)((long)&this->HaltCond[0].sign + lVar24 * 2) + 1]);
        }
        lVar20 = lVar20 + 1;
        lVar24 = lVar24 + 8;
      } while (lVar20 != 10);
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])();
      return;
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::action ()
{
  unsigned    i;
  NaVector    &x = signal.data();

  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      // prepare next gap session
      Mean.init_zero();
      RMS.init_zero();
      StdDev.init_zero();
      Min.init_zero();
      Max.init_zero();

      Sum.init_zero();
      Sum2.init_zero();

      // reset activations counter
      nGapAct = 0;
    }

  // one more activation
  ++nGapAct;

  // compute basic statistics
  for(i = 0; i < x.dim(); ++i){
    Sum[i] += x[i];
    Sum2[i] += x[i] * x[i];

    if(nGapAct == 1){
      Min[i] = x[i];
      Max[i] = x[i];
    }else{
      if(x[i] < Min[i]){
	Min[i] = x[i];
      }
      if(x[i] > Max[i]){
	Max[i] = x[i];
      }
    }

    Mean[i] = Sum[i] / nGapAct;
    RMS[i] = Sum2[i] / nGapAct;
    StdDev[i] = sqrt(RMS[i] - Mean[i] * Mean[i]);

  }// for each item of input dimension

  // compute final statistics
  NaReal	fAbs;
  if(fabs(Min[0]) > fabs(Max[0]))
    fAbs = fabs(Min[0]);
  else
    fAbs = fabs(Max[0]);

  int	id, j = 0;
  NaReal	fTime = net()->timer().CurrentTime();
  int		iTimeIndex = net()->timer().CurrentIndex();

  // put needed statistics to output
  for(id = 0; id < NaSI_number; ++id){
    switch(mOutStat & NaSIdToMask(id))
      {
      case NaSM_ABSMEAN:stat.data()[j++] = fabs(Mean[0]);break;
      case NaSM_MEAN:	stat.data()[j++] = Mean[0];	break;
      case NaSM_RMS:	stat.data()[j++] = RMS[0];	break;
      case NaSM_STDDEV:	stat.data()[j++] = StdDev[0];	break;
      case NaSM_MAX:	stat.data()[j++] = Max[0];	break;
      case NaSM_MIN:	stat.data()[j++] = Min[0];	break;
      case NaSM_ABSMAX:	stat.data()[j++] = fAbs;	break;
      case NaSM_TIME:	stat.data()[j++] = fTime;	break;
      case NaSM_TINDEX: stat.data()[j++] = iTimeIndex;	break;
      case NaSM_VALUE:  stat.data()[j++] = x[0];	break;
      }
  }

  // check some statistics for halt condition
  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      int	mHaltedBy = 0;
      for(id = 0; id < NaSI_number; ++id){
	switch(mHalt & NaSIdToMask(id))
	  {
	  case NaSM_ABSMEAN:
	    mHaltedBy |=
	      check_condition(fabs(Mean[0]), HaltCond[id].sign,
			      HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MEAN:
	    mHaltedBy |=
	      check_condition(Mean[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_RMS:
	    mHaltedBy |=
	      check_condition(RMS[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_STDDEV:
	    mHaltedBy |=
	      check_condition(StdDev[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MAX:
	    mHaltedBy |=
	      check_condition(Max[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MIN:
	    mHaltedBy |=
	      check_condition(Min[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_ABSMAX:
	    mHaltedBy |=
	      check_condition(fAbs, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TIME:
	    mHaltedBy |=
	      check_condition(fTime, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TINDEX:
	    mHaltedBy |=
	      check_condition(iTimeIndex, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  }// switch
      }// for each id

      // if any of halt flags is true...
      if(mHaltedBy & NaSM_ALL){
	NaPrintLog("Statistics node '%s' caused halt due to:\n", name());
	for(id = 0; id < NaSI_number; ++id){
	  if(mHaltedBy & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}

	// some halt condition results true
	halt();
      }
    }
}